

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl-ncurses.cpp
# Opt level: O2

bool hnInit(void)

{
  int iVar1;
  sigaction sh;
  sigaction osh;
  
  sh.__sigaction_handler.sa_handler = sigpipe_handler;
  sh.sa_flags = 0x10000000;
  sigemptyset((sigset_t *)&sh.sa_mask);
  iVar1 = sigaction(0xd,(sigaction *)&sh,(sigaction *)&osh);
  if (-1 < iVar1) {
    curl_global_init(3);
    g_cm = (CURLM *)curl_multi_init();
    curl_multi_setopt(g_cm,6,5);
  }
  return -1 < iVar1;
}

Assistant:

bool hnInit() {
#ifndef _WIN32
    struct sigaction sh;
    struct sigaction osh;

    sh.sa_handler = &sigpipe_handler; //Can set to SIG_IGN
    // Restart interrupted system calls
    sh.sa_flags = SA_RESTART;

    // Block every signal during the handler
    sigemptyset(&sh.sa_mask);

    if (sigaction(SIGPIPE, &sh, &osh) < 0) {
        return false;
    }
#endif

    curl_global_init(CURL_GLOBAL_ALL);
    g_cm = curl_multi_init();

    curl_multi_setopt(g_cm, CURLMOPT_MAXCONNECTS, (long)MAX_PARALLEL);

    return true;
}